

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

int __thiscall Net::predict(Net *this,Table *input)

{
  pointer pvVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  pointer pvVar5;
  int layer;
  int cur_layer;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  pvVar5 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)*(pointer *)
                             ((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + 8) - lVar4 >> 3);
      uVar7 = uVar7 + 1) {
    dVar8 = Table::get_value(input,(int)uVar7,0);
    pvVar5 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = *(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    *(double *)(lVar4 + uVar7 * 8) = dVar8;
  }
  cur_layer = 1;
  while( true ) {
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)(((long)pvVar1 - (long)pvVar5) / 0x18) <= cur_layer) break;
    propagate_front(this,cur_layer);
    cur_layer = cur_layer + 1;
    pvVar5 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pdVar2 = pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  for (uVar6 = 0;
      (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != uVar6; uVar6 = uVar6 + 1) {
    uVar3 = uVar6 & 0xffffffff;
    if (pdVar2[uVar6] < pdVar2[(int)uVar7] || pdVar2[uVar6] == pdVar2[(int)uVar7]) {
      uVar3 = uVar7;
    }
    uVar7 = uVar3;
  }
  return (int)uVar7;
}

Assistant:

int Net::predict(Table input){
    for (int x = 0; x < mesh[0].size(); ++x)
        mesh[0][x] = input.get_value(x, 0);
    for (int layer = 1; layer < (int)mesh.size(); ++layer)
        propagate_front(layer);

    int maxx = 0;
    for (int i = 0; i < mesh.back().size(); ++i)
        if (mesh.back()[maxx] < mesh.back()[i]) maxx = i;
    return maxx;
}